

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

void __thiscall
QPDF::insertPageobjToPage(QPDF *this,QPDFObjectHandle *obj,int pos,bool check_duplicate)

{
  int iVar1;
  pointer pMVar2;
  QPDFExc *this_00;
  element_type *peVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  __enable_if_t<is_constructible<value_type,_pair<QPDFObjGen,_int>_>::value,_pair<iterator,_bool>_>
  _Var5;
  allocator<char> local_101;
  string local_100;
  QPDFObjGen local_e0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Base_ptr local_68;
  byte local_60;
  pair<QPDFObjGen,_int> local_58;
  pair<QPDFObjGen,_int> local_48;
  _Base_ptr local_38;
  byte local_30;
  QPDFObjGen local_28;
  QPDFObjGen og;
  bool check_duplicate_local;
  int pos_local;
  QPDFObjectHandle *obj_local;
  QPDF *this_local;
  
  og.obj._3_1_ = check_duplicate;
  og.gen = pos;
  local_28 = QPDFObjectHandle::getObjGen(obj);
  iVar1 = og.gen;
  if ((og.obj._3_1_ & 1) == 0) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    pmVar4 = std::
             map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
             ::operator[](&pMVar2->pageobj_to_pages_pos,&local_28);
    *pmVar4 = iVar1;
  }
  else {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    local_58 = std::make_pair<QPDFObjGen&,int&>(&local_28,&og.gen);
    local_48.second = local_58.second;
    local_48.first = local_58.first;
    _Var5 = std::
            map<QPDFObjGen,int,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
            ::insert<std::pair<QPDFObjGen,int>>
                      ((map<QPDFObjGen,int,std::less<QPDFObjGen>,std::allocator<std::pair<QPDFObjGen_const,int>>>
                        *)&pMVar2->pageobj_to_pages_pos,&local_48);
    local_68 = (_Base_ptr)_Var5.first._M_node;
    local_60 = _Var5.second;
    if (((local_60 ^ 0xff) & 1) != 0) {
      local_38 = local_68;
      local_30 = local_60;
      std::__cxx11::to_string(&local_c8,og.gen);
      std::operator+(&local_a8,"page ",&local_c8);
      std::operator+(&local_88,&local_a8," (numbered from zero)");
      local_e0 = local_28;
      setLastObjectDescription(this,&local_88,local_28);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      this_00 = (QPDFExc *)__cxa_allocate_exception(0x80);
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar2->file);
      iVar1 = (*peVar3->_vptr_InputSource[3])();
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,
                 "duplicate page reference found; this would cause loss of data",&local_101);
      QPDFExc::QPDFExc(this_00,qpdf_e_pages,(string *)CONCAT44(extraout_var,iVar1),
                       &pMVar2->last_object_description,0,&local_100);
      __cxa_throw(this_00,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
  }
  return;
}

Assistant:

void
QPDF::insertPageobjToPage(QPDFObjectHandle const& obj, int pos, bool check_duplicate)
{
    QPDFObjGen og(obj.getObjGen());
    if (check_duplicate) {
        if (!m->pageobj_to_pages_pos.insert(std::make_pair(og, pos)).second) {
            // The library never calls insertPageobjToPage in a way that causes this to happen.
            setLastObjectDescription("page " + std::to_string(pos) + " (numbered from zero)", og);
            throw QPDFExc(
                qpdf_e_pages,
                m->file->getName(),
                m->last_object_description,
                0,
                "duplicate page reference found; this would cause loss of data");
        }
    } else {
        m->pageobj_to_pages_pos[og] = pos;
    }
}